

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateDistributionVector.h
# Opt level: O2

StateDistributionVector * __thiscall StateDistributionVector::Clone(StateDistributionVector *this)

{
  StateDistributionVector *this_00;
  
  this_00 = (StateDistributionVector *)operator_new(0x20);
  StateDistributionVector(this_00,this);
  return this_00;
}

Assistant:

virtual StateDistributionVector* Clone() const
        { return new StateDistributionVector(*this); }